

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_enum_udev.c
# Opt level: O3

int igsc_device_iterator_create(igsc_device_iterator **iter)

{
  int iVar1;
  igsc_device_iterator *__ptr;
  udev *puVar2;
  udev_enumerate *puVar3;
  igsc_log_func_t p_Var4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  char __time_buf [128];
  char local_b8 [136];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (iter == (igsc_device_iterator **)0x0) {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(local_b8,0x80);
      iVar1 = 3;
      syslog(3,"%s: IGSC: (%s:%s():%d) Bad parameters\n",pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
             ,"igsc_device_iterator_create",0x22);
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(local_b8,0x80);
      (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Bad parameters\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                ,"igsc_device_iterator_create",0x22);
      iVar1 = 3;
    }
    goto LAB_0011d7dd;
  }
  __ptr = (igsc_device_iterator *)calloc(1,0x18);
  if (__ptr == (igsc_device_iterator *)0x0) {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(local_b8,0x80);
      syslog(3,"%s: IGSC: (%s:%s():%d) Can\'t allocate iterator\n",pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
             ,"igsc_device_iterator_create",0x29);
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(local_b8,0x80);
      (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Can\'t allocate iterator\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                ,"igsc_device_iterator_create",0x29);
    }
    iVar1 = 2;
    goto LAB_0011d7dd;
  }
  puVar2 = (udev *)udev_new();
  __ptr->udev = puVar2;
  if (puVar2 == (udev *)0x0) {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(local_b8,0x80);
      syslog(3,"%s: IGSC: (%s:%s():%d) Cannot create udev\n",pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
             ,"igsc_device_iterator_create",0x30);
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(local_b8,0x80);
      (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot create udev\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                ,"igsc_device_iterator_create",0x30);
    }
  }
  else {
    puVar3 = (udev_enumerate *)udev_enumerate_new(puVar2);
    __ptr->enumerate = puVar3;
    if (puVar3 == (udev_enumerate *)0x0) {
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 == (igsc_log_func_t)0x0) {
        pcVar5 = gsc_time(local_b8,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Cannot create udev_enumerate\n",pcVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
               ,"igsc_device_iterator_create",0x38);
      }
      else {
        p_Var4 = igsc_get_log_callback_func();
        pcVar5 = gsc_time(local_b8,0x80);
        (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot create udev_enumerate\n",
                  pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                  ,"igsc_device_iterator_create",0x38);
      }
    }
    else {
      iVar1 = udev_enumerate_add_match_sysattr(puVar3,"kind","gscfi");
      if (iVar1 < 0) {
        p_Var4 = igsc_get_log_callback_func();
        if (p_Var4 != (igsc_log_func_t)0x0) {
          p_Var4 = igsc_get_log_callback_func();
          pcVar5 = gsc_time(local_b8,0x80);
          pcVar6 = "%s: IGSC: (%s:%s():%d) Cannot match udev sysattr: %d\n";
          uVar7 = 0x3f;
          goto LAB_0011d708;
        }
        pcVar5 = gsc_time(local_b8,0x80);
        pcVar6 = "%s: IGSC: (%s:%s():%d) Cannot match udev sysattr: %d\n";
        uVar7 = 0x3f;
LAB_0011d7b9:
        syslog(3,pcVar6,pcVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
               ,"igsc_device_iterator_create",uVar7,iVar1);
      }
      else {
        iVar1 = udev_enumerate_scan_devices(puVar3);
        if (-1 < iVar1) {
          *iter = __ptr;
          iVar1 = 0;
          goto LAB_0011d7dd;
        }
        p_Var4 = igsc_get_log_callback_func();
        if (p_Var4 == (igsc_log_func_t)0x0) {
          pcVar5 = gsc_time(local_b8,0x80);
          pcVar6 = "%s: IGSC: (%s:%s():%d) Cannot scan udev devices: %d\n";
          uVar7 = 0x46;
          goto LAB_0011d7b9;
        }
        p_Var4 = igsc_get_log_callback_func();
        pcVar5 = gsc_time(local_b8,0x80);
        pcVar6 = "%s: IGSC: (%s:%s():%d) Cannot scan udev devices: %d\n";
        uVar7 = 0x46;
LAB_0011d708:
        (*p_Var4)(IGSC_LOG_LEVEL_ERROR,pcVar6,pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                  ,"igsc_device_iterator_create",uVar7,iVar1);
      }
      udev_enumerate_unref(puVar3);
    }
    udev_unref(puVar2);
  }
  free(__ptr);
  iVar1 = 1;
LAB_0011d7dd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int igsc_device_iterator_create(struct igsc_device_iterator **iter)
{
    struct igsc_device_iterator *it = NULL;
    int ret;

    if (iter == NULL)
    {
        gsc_error("Bad parameters\n");
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    it = calloc(1, sizeof(*it));
    if (it == NULL)
    {
        gsc_error("Can't allocate iterator\n");
        return IGSC_ERROR_NOMEM;
    }

    it->udev = udev_new();
    if (it->udev == NULL)
    {
        gsc_error("Cannot create udev\n");
        ret = IGSC_ERROR_INTERNAL;
        goto clean_iter;
    }

    it->enumerate = udev_enumerate_new(it->udev);
    if (!it->enumerate)
    {
        gsc_error("Cannot create udev_enumerate\n");
        ret = IGSC_ERROR_INTERNAL;
        goto clean_udev;
    }

    if ((ret = udev_enumerate_add_match_sysattr(it->enumerate, "kind", "gscfi")) < 0)
    {
        gsc_error("Cannot match udev sysattr: %d\n", ret);
        ret = IGSC_ERROR_INTERNAL;
        goto clean_enum;
    }

    if ((ret = udev_enumerate_scan_devices(it->enumerate)) < 0)
    {
        gsc_error("Cannot scan udev devices: %d\n", ret);
        ret = IGSC_ERROR_INTERNAL;
        goto clean_enum;
    }
    it->entry = NULL;
    *iter = it;

    return IGSC_SUCCESS;
clean_enum:
    udev_enumerate_unref(it->enumerate);
clean_udev:
    udev_unref(it->udev);
clean_iter:
    free(it);
    return ret;
}